

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::_InternalSerialize
          (CodeGeneratorResponse_File *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  GeneratedCodeInfo *this_00;
  ulong uVar2;
  undefined8 *puVar3;
  uint8_t *puVar4;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    puVar3 = (undefined8 *)((ulong)(this->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar3,*(int *)(puVar3 + 1),SERIALIZE,
               "google.protobuf.compiler.CodeGeneratorResponse.File.name");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,1,(string *)
                                 ((ulong)(this->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),target
                       );
  }
  if ((uVar1 & 2) != 0) {
    puVar3 = (undefined8 *)((ulong)(this->insertion_point_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar3,*(int *)(puVar3 + 1),SERIALIZE,
               "google.protobuf.compiler.CodeGeneratorResponse.File.insertion_point");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,2,(string *)
                                 ((ulong)(this->insertion_point_).tagged_ptr_.ptr_ &
                                 0xfffffffffffffffe),target);
  }
  if ((uVar1 & 4) != 0) {
    puVar3 = (undefined8 *)((ulong)(this->content_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar3,*(int *)(puVar3 + 1),SERIALIZE,
               "google.protobuf.compiler.CodeGeneratorResponse.File.content");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0xf,
                        (string *)((ulong)(this->content_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                        target);
  }
  if ((uVar1 & 8) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_00 = this->generated_code_info_;
    target[0] = 0x82;
    target[1] = '\x01';
    uVar1 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[2] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar4 = target + 3;
    }
    else {
      puVar4 = io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper(uVar1,target + 2);
    }
    target = GeneratedCodeInfo::_InternalSerialize(this_00,puVar4,stream);
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return target;
  }
  puVar4 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffc) + 8),target,stream);
  return puVar4;
}

Assistant:

uint8_t* CodeGeneratorResponse_File::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.compiler.CodeGeneratorResponse.File)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorResponse.File.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // optional string insertion_point = 2;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_insertion_point().data(), static_cast<int>(this->_internal_insertion_point().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorResponse.File.insertion_point");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_insertion_point(), target);
  }

  // optional string content = 15;
  if (cached_has_bits & 0x00000004u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_content().data(), static_cast<int>(this->_internal_content().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorResponse.File.content");
    target = stream->WriteStringMaybeAliased(
        15, this->_internal_content(), target);
  }

  // optional .google.protobuf.GeneratedCodeInfo generated_code_info = 16;
  if (cached_has_bits & 0x00000008u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        16, _Internal::generated_code_info(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.compiler.CodeGeneratorResponse.File)
  return target;
}